

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O1

void __thiscall
cbtAlignedObjectArray<cbtCollisionObject_*>::~cbtAlignedObjectArray
          (cbtAlignedObjectArray<cbtCollisionObject_*> *this)

{
  if (this->m_data != (cbtCollisionObject **)0x0) {
    if (this->m_ownsMemory == true) {
      cbtAlignedFreeInternal(this->m_data);
    }
    this->m_data = (cbtCollisionObject **)0x0;
  }
  this->m_ownsMemory = true;
  this->m_data = (cbtCollisionObject **)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  return;
}

Assistant:

~cbtAlignedObjectArray()
	{
		clear();
	}